

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsExport.cpp
# Opt level: O0

HelicsBroker helicsBrokerClone(HelicsBroker broker,HelicsError *err)

{
  BrokerObject *pBVar1;
  pointer pBVar2;
  element_type *peVar3;
  void *retbroker;
  __single_object brokerClone;
  BrokerObject *brokerObj;
  shared_ptr<helics::Broker> *in_stack_ffffffffffffff88;
  HelicsError *in_stack_ffffffffffffff90;
  unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_> *this;
  HelicsBroker in_stack_ffffffffffffff98;
  unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_> local_58 [4];
  unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>
  *in_stack_ffffffffffffffc8;
  MasterObjectHolder *local_8;
  
  pBVar1 = helics::getBrokerObject(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  if (pBVar1 == (BrokerObject *)0x0) {
    local_8 = (MasterObjectHolder *)0x0;
  }
  else {
    std::make_unique<helics::BrokerObject>();
    pBVar2 = std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>::
             operator->((unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>
                         *)0x1a00e1);
    pBVar2->valid = -0x5cb982e0;
    std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>::operator->
              ((unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_> *)
               0x1a00fc);
    std::shared_ptr<helics::Broker>::operator=
              ((shared_ptr<helics::Broker> *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    local_8 = (MasterObjectHolder *)
              std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>::get
                        ((unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>
                          *)in_stack_ffffffffffffff90);
    getMasterHolder();
    peVar3 = std::__shared_ptr_access<MasterObjectHolder,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<MasterObjectHolder,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1a012e);
    this = local_58;
    std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>::unique_ptr
              (this,(unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_> *)
                    peVar3);
    MasterObjectHolder::addBroker(local_8,in_stack_ffffffffffffffc8);
    std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>::~unique_ptr
              (this);
    std::shared_ptr<MasterObjectHolder>::~shared_ptr((shared_ptr<MasterObjectHolder> *)0x1a016a);
    std::unique_ptr<helics::BrokerObject,_std::default_delete<helics::BrokerObject>_>::~unique_ptr
              (this);
  }
  return local_8;
}

Assistant:

HelicsBroker helicsBrokerClone(HelicsBroker broker, HelicsError* err)
{
    auto* brokerObj = helics::getBrokerObject(broker, err);
    if (brokerObj == nullptr) {
        return nullptr;
    }
    auto brokerClone = std::make_unique<helics::BrokerObject>();
    brokerClone->valid = gBrokerValidationIdentifier;
    brokerClone->brokerptr = brokerObj->brokerptr;
    auto* retbroker = reinterpret_cast<HelicsBroker>(brokerClone.get());
    getMasterHolder()->addBroker(std::move(brokerClone));
    return retbroker;
}